

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_ncell(REF_GRID ref_grid,REF_INT *ncell)

{
  long lVar1;
  int iVar2;
  
  *ncell = 0;
  lVar1 = 0;
  iVar2 = 0;
  do {
    iVar2 = iVar2 + ref_grid->cell[lVar1]->n;
    *ncell = iVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_ncell(REF_GRID ref_grid, REF_INT *ncell) {
  REF_INT group;
  REF_CELL ref_cell;
  *ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    (*ncell) += ref_cell_n(ref_cell);
  }
  return REF_SUCCESS;
}